

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morse.hpp
# Opt level: O0

void __thiscall OpenMD::Morse::~Morse(Morse *this)

{
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  *in_RDI = &PTR__Morse_004fff60;
  std::__cxx11::string::~string((string *)(in_RDI + 0x16));
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x2cf5be);
  std::
  vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
  ::~vector((vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
             *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2cf5e8);
  VanDerWaalsInteraction::~VanDerWaalsInteraction((VanDerWaalsInteraction *)0x2cf5f2);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }